

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

void rf_gfx_end(void)

{
  int iVar1;
  rf_gfx_color_data_type *prVar2;
  rf_gfx_texcoord_data_type *prVar3;
  rf_context *prVar4;
  rf_render_batch *prVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  rf_vertex_buffer *prVar9;
  uint uVar10;
  int iVar11;
  bool bVar12;
  
  prVar4 = rf__ctx;
  prVar5 = (rf__ctx->field_0).current_batch;
  lVar6 = prVar5->current_buffer;
  prVar9 = prVar5->vertex_buffers;
  iVar7 = prVar9[lVar6].v_counter;
  uVar10 = iVar7 - prVar9[lVar6].c_counter;
  if (uVar10 != 0) {
    uVar8 = 0;
    if (0 < (int)uVar10) {
      uVar8 = (ulong)uVar10;
    }
    while (bVar12 = uVar8 != 0, uVar8 = uVar8 - 1, bVar12) {
      prVar9[lVar6].colors[(long)prVar9[lVar6].c_counter * 4] =
           prVar9[lVar6].colors[(long)prVar9[lVar6].c_counter * 4 + -4];
      prVar5 = (prVar4->field_0).current_batch;
      prVar9 = prVar5->vertex_buffers;
      lVar6 = prVar5->current_buffer;
      prVar2 = prVar9[lVar6].colors;
      lVar6 = (long)prVar9[lVar6].c_counter;
      prVar2[(long)(int)(lVar6 << 2) + 1] = prVar2[lVar6 * 4 + -3];
      prVar5 = (prVar4->field_0).current_batch;
      lVar6 = prVar5->current_buffer;
      prVar9 = prVar5->vertex_buffers;
      prVar2 = prVar9[lVar6].colors;
      lVar6 = (long)prVar9[lVar6].c_counter;
      prVar2[(long)(int)(lVar6 << 2) + 2] = prVar2[lVar6 * 4 + -2];
      prVar5 = (prVar4->field_0).current_batch;
      prVar9 = prVar5->vertex_buffers;
      lVar6 = prVar5->current_buffer;
      prVar2 = prVar9[lVar6].colors;
      lVar6 = (long)prVar9[lVar6].c_counter;
      prVar2[(long)(int)(lVar6 << 2) + 3] = prVar2[lVar6 * 4 + -1];
      prVar5 = (prVar4->field_0).current_batch;
      lVar6 = prVar5->current_buffer;
      prVar9 = prVar5->vertex_buffers;
      prVar9[lVar6].c_counter = prVar9[lVar6].c_counter + 1;
    }
    iVar7 = prVar9[lVar6].v_counter;
  }
  iVar1 = prVar9[lVar6].tc_counter;
  uVar10 = iVar7 - iVar1;
  if (uVar10 != 0) {
    uVar8 = 0;
    if (0 < (int)uVar10) {
      uVar8 = (ulong)uVar10;
    }
    iVar11 = iVar1 * 2;
    while( true ) {
      iVar1 = iVar1 + 1;
      bVar12 = uVar8 == 0;
      uVar8 = uVar8 - 1;
      if (bVar12) break;
      prVar3 = prVar9[lVar6].texcoords;
      prVar3[iVar11] = 0.0;
      prVar3[iVar11 + 1] = 0.0;
      prVar9[lVar6].tc_counter = iVar1;
      iVar11 = iVar11 + 2;
    }
  }
  prVar5->current_depth = prVar5->current_depth + 5e-05;
  if (iVar7 < prVar9[lVar6].elements_count * 4 + -4) {
    return;
  }
  for (lVar6 = (long)(prVar4->field_0).stack_counter; -1 < lVar6; lVar6 = lVar6 + -1) {
    rf_gfx_pop_matrix();
  }
  rf_gfx_draw();
  return;
}

Assistant:

RF_API void rf_gfx_end()
{
    // Make sure vertex_count is the same for vertices, texcoords, colors and normals
    // NOTE: In OpenGL 1.1, one glColor call can be made for all the subsequent glVertex calls

    // Make sure colors count match vertex count
    if (rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter != rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter)
    {
        int add_colors = rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter - rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter;

        for (rf_int i = 0; i < add_colors; i++)
        {
            rf_batch.vertex_buffers[rf_batch.current_buffer].colors[4 * rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter] = rf_batch.vertex_buffers[rf_batch.current_buffer].colors[4 * rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter - 4];
            rf_batch.vertex_buffers[rf_batch.current_buffer].colors[4 * rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter + 1] = rf_batch.vertex_buffers[rf_batch.current_buffer].colors[4 * rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter - 3];
            rf_batch.vertex_buffers[rf_batch.current_buffer].colors[4 * rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter + 2] = rf_batch.vertex_buffers[rf_batch.current_buffer].colors[4 * rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter - 2];
            rf_batch.vertex_buffers[rf_batch.current_buffer].colors[4 * rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter + 3] = rf_batch.vertex_buffers[rf_batch.current_buffer].colors[4 * rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter - 1];
            rf_batch.vertex_buffers[rf_batch.current_buffer].c_counter++;
        }
    }

    // Make sure texcoords count match vertex count
    if (rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter != rf_batch.vertex_buffers[rf_batch.current_buffer].tc_counter)
    {
        int add_tex_coords = rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter - rf_batch.vertex_buffers[rf_batch.current_buffer].tc_counter;

        for (rf_int i = 0; i < add_tex_coords; i++)
        {
            rf_batch.vertex_buffers[rf_batch.current_buffer].texcoords[2*rf_batch.vertex_buffers[rf_batch.current_buffer].tc_counter] = 0.0f;
            rf_batch.vertex_buffers[rf_batch.current_buffer].texcoords[2*rf_batch.vertex_buffers[rf_batch.current_buffer].tc_counter + 1] = 0.0f;
            rf_batch.vertex_buffers[rf_batch.current_buffer].tc_counter++;
        }
    }

    // TODO: Make sure normals count match vertex count... if normals support is added in a future... :P

    // NOTE: Depth increment is dependant on rf_gfx_ortho(): z-near and z-far values,
    // as well as depth buffer bit-depth (16bit or 24bit or 32bit)
    // Correct increment formula would be: depthInc = (zfar - znear)/pow(2, bits)
    rf_batch.current_depth += (1.0f/20000.0f);

    // Verify internal buffers limits
    // NOTE: This check is combined with usage of rf_gfx_check_buffer_limit()
    if ((rf_batch.vertex_buffers[rf_batch.current_buffer].v_counter) >= (rf_batch.vertex_buffers[rf_batch.current_buffer].elements_count * 4 - 4))
    {
        // WARNING: If we are between rf_gfx_push_matrix() and rf_gfx_pop_matrix() and we need to force a rf_gfx_draw(),
        // we need to call rf_gfx_pop_matrix() before to recover *rf_ctx->gl_ctx.current_matrix (rf_ctx->gl_ctx.modelview) for the next forced draw call!
        // If we have multiple matrix pushed, it will require "rf_ctx->gl_ctx.stack_counter" pops before launching the draw
        for (rf_int i = rf_ctx.stack_counter; i >= 0; i--) rf_gfx_pop_matrix();
        rf_gfx_draw();
    }
}